

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::PrintObs(Parser *this,OBS_TYPE obs,ostream *out)

{
  pointer pNVar1;
  ostream *poVar2;
  int o;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> obs_vec;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&obs_vec,((long)(this->obs_vars_).
                             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->obs_vars_).
                            super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x78,&local_49);
  pNVar1 = (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->obs_vars_).
                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pNVar1) / 0x78 & 0xffffffff;
  while( true ) {
    uVar4 = uVar4 - 1;
    if ((int)(uint)uVar4 < 0) break;
    uVar5 = (uint)uVar4 & 0x7fffffff;
    uVar6 = (ulong)(int)((ulong)((long)*(pointer *)
                                        ((long)&pNVar1[uVar5].super_Variable.values_.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        + 8) -
                                *(long *)&pNVar1[uVar5].super_Variable.values_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data) >> 5);
    obs_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar5] = (int)(obs % uVar6);
    obs = obs / uVar6;
  }
  std::operator<<(out,"[");
  lVar7 = 0x58;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->obs_vars_).
                             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->obs_vars_).
                            super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x78); uVar4 = uVar4 + 1) {
    pcVar3 = ", ";
    if (uVar4 == 0) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(out,pcVar3);
    poVar2 = std::operator<<(poVar2,(string *)
                                    ((long)&(((this->obs_vars_).
                                              super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_Variable)._vptr_Variable + lVar7));
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,(string *)
                           ((long)obs_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar4] * 0x20 +
                           *(long *)((long)(this->obs_vars_).
                                           super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x50
                                    )));
    lVar7 = lVar7 + 0x78;
  }
  poVar2 = std::operator<<(out,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&obs_vec.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void Parser::PrintObs(OBS_TYPE obs, ostream& out) const {
	vector<int> obs_vec(obs_vars_.size());
	for (int o = obs_vars_.size() - 1; o >= 0; o--) {
		obs_vec[o] = obs % obs_vars_[o].Size();
		obs /= obs_vars_[o].Size();
	}

	out << "[";
	for (int o = 0; o < obs_vars_.size(); o++) {
		out << (o == 0 ? "" : ", ") << obs_vars_[o].name() << ":"
			<< obs_vars_[o].GetValue(obs_vec[o]);
	}
	out << "]" << endl;
}